

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyGuard.h
# Opt level: O2

void __thiscall
Js::JitPolyEquivalentTypeGuard::JitPolyEquivalentTypeGuard
          (JitPolyEquivalentTypeGuard *this,int index,uint32 objTypeSpecFldId)

{
  uint i;
  long lVar1;
  
  (this->super_JitEquivalentTypeGuard).super_JitIndexedPropertyGuard.super_PropertyGuard.value = 1;
  *(int *)&(this->super_JitEquivalentTypeGuard).super_JitIndexedPropertyGuard.super_PropertyGuard.
           field_0xc = index;
  (this->super_JitEquivalentTypeGuard).cache = (EquivalentTypeCache *)0x0;
  (this->super_JitEquivalentTypeGuard).objTypeSpecFldId = objTypeSpecFldId;
  (this->super_JitEquivalentTypeGuard).super_JitIndexedPropertyGuard.super_PropertyGuard.isPoly =
       true;
  (this->super_JitEquivalentTypeGuard).super_JitIndexedPropertyGuard.super_PropertyGuard.
  wasReincarnated = false;
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    this->polyValues[lVar1] = 1;
  }
  return;
}

Assistant:

JitPolyEquivalentTypeGuard(int index, uint32 objTypeSpecFldId) : JitEquivalentTypeGuard(index, objTypeSpecFldId)
    {
        isPoly = true;

        for (uint i = 0; i < GetSize(); i++)
        {
            polyValues[i] = GuardValue::Uninitialized;
        }
    }